

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O3

int __thiscall
icu_63::Formattable::clone
          (Formattable *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Formattable *this_00;
  
  this_00 = (Formattable *)UMemory::operator_new((UMemory *)0x70,(size_t)__fn);
  if (this_00 != (Formattable *)0x0) {
    Formattable(this_00,this);
  }
  return (int)this_00;
}

Assistant:

Formattable *
Formattable::clone() const {
    return new Formattable(*this);
}